

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void encode_xq(int *xq,int *xqd,sgr_params_type *params)

{
  int iVar1;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  
  if (*in_RDX == 0) {
    *in_RSI = 0;
    iVar1 = clamp(0x80 - in_RDI[1],-0x20,0x5f);
    in_RSI[1] = iVar1;
  }
  else if (in_RDX[1] == 0) {
    iVar1 = clamp(*in_RDI,-0x60,0x1f);
    *in_RSI = iVar1;
    iVar1 = clamp(0x80 - *in_RSI,-0x20,0x5f);
    in_RSI[1] = iVar1;
  }
  else {
    iVar1 = clamp(*in_RDI,-0x60,0x1f);
    *in_RSI = iVar1;
    iVar1 = clamp((0x80 - *in_RSI) - in_RDI[1],-0x20,0x5f);
    in_RSI[1] = iVar1;
  }
  return;
}

Assistant:

static inline void encode_xq(int *xq, int *xqd, const sgr_params_type *params) {
  if (params->r[0] == 0) {
    xqd[0] = 0;
    xqd[1] = clamp((1 << SGRPROJ_PRJ_BITS) - xq[1], SGRPROJ_PRJ_MIN1,
                   SGRPROJ_PRJ_MAX1);
  } else if (params->r[1] == 0) {
    xqd[0] = clamp(xq[0], SGRPROJ_PRJ_MIN0, SGRPROJ_PRJ_MAX0);
    xqd[1] = clamp((1 << SGRPROJ_PRJ_BITS) - xqd[0], SGRPROJ_PRJ_MIN1,
                   SGRPROJ_PRJ_MAX1);
  } else {
    xqd[0] = clamp(xq[0], SGRPROJ_PRJ_MIN0, SGRPROJ_PRJ_MAX0);
    xqd[1] = clamp((1 << SGRPROJ_PRJ_BITS) - xqd[0] - xq[1], SGRPROJ_PRJ_MIN1,
                   SGRPROJ_PRJ_MAX1);
  }
}